

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

FxExpression * __thiscall FxUnaryNotBoolean::Resolve(FxUnaryNotBoolean *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FxBoolCast *this_00;
  undefined4 extraout_var_00;
  FxConstant *this_01;
  ExpVal local_40;
  FxExpression *x;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Operand != (FxExpression *)0x0) {
    iVar2 = (*this->Operand->_vptr_FxExpression[2])();
    x = (FxExpression *)CONCAT44(extraout_var,iVar2);
    this->Operand = x;
    if (x != (FxExpression *)0x0) {
      if (x->ValueType != (PType *)TypeBool) {
        this_00 = (FxBoolCast *)operator_new(0x40);
        FxBoolCast::FxBoolCast(this_00,x);
        this->Operand = (FxExpression *)this_00;
        iVar2 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
        x = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
        this->Operand = x;
        if (x == (FxExpression *)0x0) goto LAB_005d0ced;
      }
      iVar2 = (*x->_vptr_FxExpression[3])(x);
      if ((char)iVar2 == '\0') {
        (this->super_FxExpression).ValueType = (PType *)TypeBool;
        return &this->super_FxExpression;
      }
      ExpVal::ExpVal(&local_40,(ExpVal *)(this->Operand + 1));
      bVar1 = ExpVal::GetBool(&local_40);
      ExpVal::~ExpVal(&local_40);
      this_01 = (FxConstant *)operator_new(0x48);
      FxConstant::FxConstant(this_01,!bVar1,&(this->super_FxExpression).ScriptPosition);
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return &this_01->super_FxExpression;
    }
  }
LAB_005d0ced:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxUnaryNotBoolean::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->ValueType != TypeBool)
	{
		Operand = new FxBoolCast(Operand);
		SAFE_RESOLVE(Operand, ctx);
	}

	if (Operand->isConstant())
	{
		bool result = !static_cast<FxConstant *>(Operand)->GetValue().GetBool();
		FxExpression *e = new FxConstant(result, ScriptPosition);
		delete this;
		return e;
	}

	ValueType = TypeBool;
	return this;
}